

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall
pbrt::BinaryWriter::write<pbrt::math::vec3i,std::allocator<pbrt::math::vec3i>,void>
          (BinaryWriter *this,vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *t)

{
  bool bVar1;
  vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *this_00;
  vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *in_RSI;
  void *in_RDI;
  BinaryWriter *unaff_retaddr;
  size_t size;
  unsigned_long *in_stack_ffffffffffffffc8;
  BinaryWriter *in_stack_ffffffffffffffd0;
  
  this_00 = (vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
            std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::size(in_RSI);
  write<unsigned_long>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  bVar1 = std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::empty(this_00);
  if (!bVar1) {
    std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::data
              ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)0x113158);
    std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::size(in_RSI);
    writeRaw(unaff_retaddr,in_RDI,(size_t)in_RSI);
  }
  return;
}

Assistant:

void write(const std::vector<T, A> &t)
    {
      size_t size = t.size();
      write((uint64_t)size);
      if (!t.empty())
        writeRaw(t.data(),t.size()*sizeof(T));
    }